

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polynomialfit.cpp
# Opt level: O0

void __thiscall PolynomialFit::releaseMatrix(PolynomialFit *this)

{
  long in_RDI;
  
  if (*(long *)(in_RDI + 0x40) != 0) {
    if (*(void **)(in_RDI + 0x40) != (void *)0x0) {
      operator_delete__(*(void **)(in_RDI + 0x40));
    }
    *(undefined8 *)(in_RDI + 0x40) = 0;
  }
  if (*(long *)(in_RDI + 0x48) != 0) {
    if (*(void **)(in_RDI + 0x48) != (void *)0x0) {
      operator_delete__(*(void **)(in_RDI + 0x48));
    }
    *(undefined8 *)(in_RDI + 0x48) = 0;
  }
  if (*(long *)(in_RDI + 0x50) != 0) {
    if (*(void **)(in_RDI + 0x50) != (void *)0x0) {
      operator_delete__(*(void **)(in_RDI + 0x50));
    }
    *(undefined8 *)(in_RDI + 0x50) = 0;
  }
  return;
}

Assistant:

void PolynomialFit::releaseMatrix()
{
    if(matrix ){
        delete [] matrix ;
        matrix = NULL;
    }

    if(rvector){
        delete [] rvector;
        rvector = NULL;
    }

    if(results){
        delete [] results;
        results = NULL;
    }
}